

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_tapfail.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  tst_qpromise_tapfail tc;
  QCoreApplication app;
  int local_2c;
  undefined **local_28 [2];
  QCoreApplication local_18 [16];
  
  local_2c = argc;
  QCoreApplication::QCoreApplication(local_18,&local_2c,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  QObject::QObject((QObject *)local_28,(QObject *)0x0);
  local_28[0] = &PTR_metaObject_001275d8;
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tapfail.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O1/tests/auto/qtpromise/qpromise"
            );
  iVar1 = QTest::qExec((QObject *)local_28,local_2c,argv);
  QObject::~QObject((QObject *)local_28);
  QCoreApplication::~QCoreApplication(local_18);
  return iVar1;
}

Assistant:

void tst_qpromise_tapfail::fulfilled()
{
    int value = -1;
    auto p = QtPromise::QPromise<int>::resolve(42).tapFail([&]() {
        value = 43;
    });

    QCOMPARE(waitForValue(p, 42), 42);
    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(value, -1);
}